

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O1

void traverse_hplane_sim<PredictionData<float,unsigned_long>,long_double>
               (WorkerForSimilarity *workspace,PredictionData<float,_unsigned_long> *prediction_data
               ,ExtIsoForest *model_outputs,vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,
               size_t curr_tree,bool as_kernel)

{
  ulong *puVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  pointer pdVar5;
  pointer pIVar6;
  size_t *psVar7;
  size_t sVar8;
  double *pdVar9;
  unsigned_long uVar10;
  size_t n;
  ExtIsoForest *pEVar11;
  ulong *puVar12;
  ulong uVar13;
  long lVar14;
  pointer pIVar15;
  ulong uVar16;
  size_t sVar17;
  ExtIsoForest *model_outputs_00;
  ulong *puVar18;
  pointer puVar19;
  long lVar20;
  double *pdVar21;
  pointer puVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes_00;
  double dVar26;
  double unused;
  double local_70;
  double *local_68;
  size_t local_60;
  long local_58;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *local_50;
  ExtIsoForest *local_48;
  long local_40;
  long local_38;
  
  if (!interrupt_switch) {
    if (workspace->st != workspace->end) {
      local_50 = hplanes;
      local_48 = model_outputs;
      if ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar22 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar19 = puVar22 + workspace->st;
        puVar22 = puVar22 + workspace->end + 1;
        if (puVar19 != puVar22) {
          uVar13 = (long)puVar22 - (long)puVar19 >> 3;
          lVar14 = 0x3f;
          if (uVar13 != 0) {
            for (; uVar13 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar19,puVar22,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar19,puVar22);
        }
        puVar19 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (workspace->n_from <= puVar19[workspace->st]) {
          return;
        }
        if (puVar19[workspace->end] < workspace->n_from) {
          return;
        }
      }
      hplanes_00 = local_50;
      pIVar15 = (local_50->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (pIVar15[curr_tree].hplane_left == 0) {
        pdVar21 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar9 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (as_kernel) {
          if (pdVar21 == pdVar9) {
            pdVar5 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (pdVar5 != (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish) {
              puVar19 = (workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar13 = workspace->st;
              puVar1 = puVar19 + uVar13;
              uVar16 = workspace->end;
              uVar24 = (long)((long)puVar19 + (uVar16 * 8 - (long)puVar1) + 8) >> 3;
              puVar18 = puVar1;
              if (0 < (long)uVar24) {
                do {
                  uVar25 = uVar24 >> 1;
                  uVar24 = ~uVar25 + uVar24;
                  puVar12 = puVar18 + uVar25 + 1;
                  if (workspace->n_from <= puVar18[uVar25]) {
                    uVar24 = uVar25;
                    puVar12 = puVar18;
                  }
                  puVar18 = puVar12;
                } while (0 < (long)uVar24);
              }
              uVar24 = ((long)puVar18 - (long)puVar1 >> 3) + uVar13;
              if (uVar13 < uVar24) {
                sVar17 = workspace->n_from;
                do {
                  if (uVar24 <= uVar16) {
                    lVar14 = puVar19[uVar13] * sVar17;
                    uVar25 = uVar24;
                    do {
                      lVar20 = puVar19[uVar25] - sVar17;
                      pdVar5[lVar14 + lVar20] = pdVar5[lVar14 + lVar20] + 1.0;
                      uVar25 = uVar25 + 1;
                    } while (uVar25 <= uVar16);
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar24);
              }
            }
          }
          else {
            uVar13 = workspace->end;
            if (workspace->st < uVar13) {
              puVar19 = (workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar14 = (long)pdVar9 - (long)pdVar21 >> 3;
              uVar16 = workspace->st;
              do {
                uVar24 = uVar16 + 1;
                if (uVar16 < uVar13) {
                  uVar16 = puVar19[uVar16];
                  sVar17 = prediction_data->nrows;
                  lVar20 = sVar17 - uVar16;
                  uVar25 = uVar24;
                  do {
                    uVar3 = puVar19[uVar25];
                    if (uVar16 < uVar3) {
                      lVar23 = uVar3 + (lVar14 - uVar16) + ~((ulong)((lVar20 + -1) * lVar20) >> 1);
                    }
                    else {
                      lVar23 = sVar17 - uVar3;
                      lVar23 = ((uVar16 + lVar14) - uVar3) + ~((ulong)((lVar23 + -1) * lVar23) >> 1)
                      ;
                    }
                    pdVar21[lVar23] = pdVar21[lVar23] + 1.0;
                    uVar25 = uVar25 + 1;
                  } while (uVar25 <= uVar13);
                }
                uVar16 = uVar24;
              } while (uVar24 != uVar13);
            }
          }
        }
        else {
          if (pdVar21 != pdVar9) {
            psVar7 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar17 = workspace->st;
            sVar8 = workspace->end;
            sVar4 = prediction_data->nrows;
            if (workspace->assume_full_distr == false) {
              local_38 = (sVar8 - sVar17) + 1;
              dVar26 = expected_separation_depth<long_double>
                                 ((longdouble)local_38 +
                                  (longdouble)(float)(&DAT_0036b0d8)[local_38 < 0] +
                                  (longdouble)pIVar15[curr_tree].remainder);
            }
            else {
              dVar26 = 3.0;
            }
            increase_comb_counter(psVar7,sVar17,sVar8,sVar4,pdVar21,dVar26);
            return;
          }
          pdVar21 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pdVar21 !=
              (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            psVar7 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar17 = workspace->st;
            sVar8 = workspace->end;
            sVar4 = workspace->n_from;
            n = prediction_data->nrows;
            if (workspace->assume_full_distr == false) {
              local_40 = (sVar8 - sVar17) + 1;
              dVar26 = expected_separation_depth<long_double>
                                 ((longdouble)local_40 +
                                  (longdouble)(float)(&DAT_0036b0d8)[local_40 < 0] +
                                  (longdouble)pIVar15[curr_tree].remainder);
            }
            else {
              dVar26 = 3.0;
            }
            increase_comb_counter_in_groups(psVar7,sVar17,sVar8,sVar4,n,pdVar21,dVar26);
            return;
          }
        }
      }
      else {
        if (curr_tree != 0 && !as_kernel) {
          pdVar21 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (pdVar21 ==
              (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pdVar21 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (pdVar21 !=
                (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              increase_comb_counter_in_groups
                        ((workspace->ix_arr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,workspace->st,workspace->end,
                         workspace->n_from,prediction_data->nrows,pdVar21,-1.0);
            }
          }
          else {
            increase_comb_counter
                      ((workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,workspace->st,workspace->end,
                       prediction_data->nrows,pdVar21,-1.0);
          }
        }
        if ((prediction_data->Xc_indptr != (unsigned_long *)0x0) &&
           ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start)) {
          puVar22 = (workspace->ix_arr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar19 = puVar22 + workspace->st;
          puVar22 = puVar22 + workspace->end + 1;
          if (puVar19 != puVar22) {
            uVar13 = (long)puVar22 - (long)puVar19 >> 3;
            lVar14 = 0x3f;
            if (uVar13 != 0) {
              for (; uVar13 >> lVar14 == 0; lVar14 = lVar14 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar19,puVar22,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar19);
          }
        }
        model_outputs_00 = local_48;
        pdVar5 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = workspace->end - workspace->st;
        if (pdVar5 != pdVar5 + lVar14 + 1) {
          memset(pdVar5,0,lVar14 * 8 + 8);
        }
        pIVar6 = (hplanes_00->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pIVar15 = pIVar6 + curr_tree;
        puVar19 = *(pointer *)
                   &pIVar6[curr_tree].col_num.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
        puVar22 = *(pointer *)
                   ((long)&pIVar6[curr_tree].col_num.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   + 8);
        if (prediction_data->Xc_indptr == (unsigned_long *)0x0 &&
            prediction_data->categ_data == (int *)0x0) {
          if (puVar22 != puVar19) {
            uVar13 = 0;
            do {
              pdVar21 = &local_70;
              if (model_outputs_00->missing_action != Fail) {
                pdVar21 = (double *)
                          (*(long *)&(pIVar15->fill_val).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + uVar13 * 8);
              }
              add_linear_comb<float>
                        ((workspace->ix_arr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,workspace->st,workspace->end,
                         (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         prediction_data->numeric_data + puVar19[uVar13] * prediction_data->nrows,
                         (double *)
                         (uVar13 * 8 +
                         *(long *)&(pIVar15->coef).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data),0.0,
                         *(double *)
                          (*(long *)&(pIVar15->mean).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + uVar13 * 8),pdVar21,
                         model_outputs_00->missing_action,(double *)0x0,(size_t *)0x0,false);
              uVar13 = uVar13 + 1;
              pIVar6 = (hplanes_00->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pIVar15 = pIVar6 + curr_tree;
              puVar19 = *(pointer *)
                         &pIVar6[curr_tree].col_num.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
            } while (uVar13 < (ulong)((long)*(pointer *)
                                             ((long)&pIVar6[curr_tree].col_num.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + 8) - (long)puVar19 >> 3));
          }
        }
        else if (puVar22 != puVar19) {
          lVar14 = 0;
          uVar13 = 0;
          local_58 = 0;
          sVar17 = 0;
          do {
            pEVar11 = local_48;
            iVar2 = *(int *)(*(long *)&(pIVar15->col_type).
                                       super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl
                                       .super__Vector_impl_data + uVar13 * 4);
            if (iVar2 == 0x20) {
              if (model_outputs_00->cat_split_type == SubSet) {
                pdVar21 = &local_70;
                if (model_outputs_00->missing_action != Fail) {
                  pdVar21 = (double *)
                            (*(long *)&(pIVar15->fill_val).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar14);
                }
                local_68 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                lVar20 = *(long *)&(pIVar15->cat_coef).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data;
                pdVar9 = *(double **)(lVar20 + local_58 * 0x18);
                local_60 = sVar17;
                add_linear_comb<long_double>
                          ((workspace->ix_arr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,workspace->st,workspace->end,local_68,
                           prediction_data->categ_data + puVar19[uVar13] * prediction_data->nrows,
                           (int)((ulong)(*(long *)(lVar20 + 8 + local_58 * 0x18) - (long)pdVar9) >>
                                3),pdVar9,0.0,0,pdVar21,
                           (double *)
                           (local_58 * 8 +
                           *(long *)&(pIVar15->fill_new).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data),(size_t *)0x0,(size_t *)0x0,
                           model_outputs_00->new_cat_action,model_outputs_00->missing_action,SubSet,
                           false);
                sVar17 = local_60;
                hplanes_00 = local_50;
              }
              else if (model_outputs_00->cat_split_type == SingleCateg) {
                pdVar21 = &local_70;
                if (model_outputs_00->missing_action != Fail) {
                  pdVar21 = (double *)
                            (*(long *)&(pIVar15->fill_val).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar14);
                }
                pdVar9 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                add_linear_comb<long_double>
                          ((workspace->ix_arr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,workspace->st,workspace->end,pdVar9,
                           prediction_data->categ_data + puVar19[uVar13] * prediction_data->nrows,0,
                           (double *)0x0,
                           *(double *)
                            (*(long *)&(pIVar15->fill_new).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + local_58 * 8),
                           *(int *)(*(long *)&(pIVar15->chosen_cat).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + local_58 * 4),pdVar21,pdVar9
                           ,(size_t *)0x0,(size_t *)0x0,local_48->new_cat_action,
                           model_outputs_00->missing_action,SingleCateg,false);
                model_outputs_00 = pEVar11;
              }
              local_58 = local_58 + 1;
            }
            else if (iVar2 == 0x1f) {
              psVar7 = (workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              sVar8 = workspace->end;
              if (prediction_data->Xc_indptr == (unsigned_long *)0x0) {
                pdVar21 = &local_70;
                if (model_outputs_00->missing_action != Fail) {
                  pdVar21 = (double *)
                            (*(long *)&(pIVar15->fill_val).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar14);
                }
                add_linear_comb<float>
                          (psVar7,workspace->st,sVar8,
                           (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           prediction_data->numeric_data + puVar19[uVar13] * prediction_data->nrows,
                           (double *)
                           (sVar17 * 8 +
                           *(long *)&(pIVar15->coef).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data),0.0,
                           *(double *)
                            (*(long *)&(pIVar15->mean).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + sVar17 * 8),pdVar21,
                           model_outputs_00->missing_action,(double *)0x0,(size_t *)0x0,false);
              }
              else {
                pdVar21 = &local_70;
                if (model_outputs_00->missing_action != Fail) {
                  pdVar21 = (double *)
                            (*(long *)&(pIVar15->fill_val).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + lVar14);
                }
                local_68 = (double *)prediction_data->Xc;
                local_60 = sVar8;
                add_linear_comb<float,unsigned_long>
                          (psVar7,workspace->st,sVar8,puVar19[uVar13],
                           (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start,(float *)local_68,
                           prediction_data->Xc_ind,prediction_data->Xc_indptr,
                           (double *)
                           (sVar17 * 8 +
                           *(long *)&(pIVar15->coef).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data),0.0,
                           *(double *)
                            (*(long *)&(pIVar15->mean).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + sVar17 * 8),pdVar21,
                           model_outputs_00->missing_action,(double *)0x0,(size_t *)0x0,false);
                model_outputs_00 = local_48;
                hplanes_00 = local_50;
              }
              sVar17 = sVar17 + 1;
            }
            uVar13 = uVar13 + 1;
            pIVar6 = (hplanes_00->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            pIVar15 = pIVar6 + curr_tree;
            puVar19 = *(pointer *)
                       &pIVar6[curr_tree].col_num.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
            lVar14 = lVar14 + 8;
          } while (uVar13 < (ulong)((long)*(pointer *)
                                           ((long)&pIVar6[curr_tree].col_num.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + 8) - (long)puVar19 >> 3));
        }
        uVar13 = workspace->st;
        uVar16 = workspace->end;
        pIVar15 = (hplanes_00->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar24 = uVar13;
        if (uVar13 <= uVar16) {
          puVar19 = (workspace->ix_arr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar21 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar26 = pIVar15[curr_tree].split_point;
          do {
            if (*pdVar21 <= dVar26) {
              uVar10 = puVar19[uVar24];
              puVar19[uVar24] = puVar19[uVar13];
              puVar19[uVar13] = uVar10;
              uVar24 = uVar24 + 1;
            }
            uVar13 = uVar13 + 1;
            pdVar21 = pdVar21 + 1;
          } while (uVar13 <= uVar16);
        }
        uVar13 = workspace->end;
        if (workspace->st < uVar24) {
          workspace->end = uVar24 - 1;
          traverse_hplane_sim<PredictionData<float,unsigned_long>,long_double>
                    (workspace,prediction_data,model_outputs_00,hplanes_00,
                     pIVar15[curr_tree].hplane_left,as_kernel);
        }
        if (uVar24 <= uVar13) {
          workspace->st = uVar24;
          workspace->end = uVar13;
          traverse_hplane_sim<PredictionData<float,unsigned_long>,long_double>
                    (workspace,prediction_data,model_outputs_00,hplanes_00,
                     (hplanes_00->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl
                     .super__Vector_impl_data._M_start[curr_tree].hplane_right,as_kernel);
        }
      }
    }
  }
  return;
}

Assistant:

void traverse_hplane_sim(WorkerForSimilarity     &workspace,
                         PredictionData          &prediction_data,
                         ExtIsoForest            &model_outputs,
                         std::vector<IsoHPlane>  &hplanes,
                         size_t                  curr_tree,
                         const bool              as_kernel)
{
    if (interrupt_switch)
        return;
    
    if (workspace.st == workspace.end)
        return;

    if (workspace.tmat_sep.empty())
    {
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
        if (workspace.ix_arr[workspace.st] >= workspace.n_from)
            return;
        if (workspace.ix_arr[workspace.end] < workspace.n_from)
            return;
    }

    /* Note: the first separation step will not be added here, as it simply consists of adding +1
       to every combination regardless. It has to be added at the end in 'gather_sim_result' to
       obtain the average separation depth. */
    if (hplanes[curr_tree].hplane_left == 0)
    {
        if (!as_kernel)
        {
            if (!workspace.tmat_sep.empty())
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(),
                                      workspace.assume_full_distr? 3. : 
                                      expected_separation_depth((ldouble_safe) hplanes[curr_tree].remainder
                                                                  + (ldouble_safe)(workspace.end - workspace.st + 1))
                                      );
            else if (!workspace.rmat.empty())
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.n_from,
                                                prediction_data.nrows, workspace.rmat.data(),
                                                workspace.assume_full_distr? 3. : 
                                                expected_separation_depth((ldouble_safe) hplanes[curr_tree].remainder
                                                                            + (ldouble_safe)(workspace.end - workspace.st + 1))
                                                );
        }

        else
        {
            if (!workspace.tmat_sep.empty())
            {
                size_t i_, j_;
                for (size_t i = workspace.st; i < workspace.end; i++)
                {
                    i_ = workspace.ix_arr[i];
                    for (size_t j = i + 1; j <= workspace.end; j++)
                    {
                        j_ = workspace.ix_arr[j];
                        workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]++;
                    }
                }
            }

            else if (!workspace.rmat.empty())
            {
                size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                               std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                workspace.ix_arr.begin() + workspace.end + 1,
                                                                workspace.n_from));
                double *restrict rmat_this;
                for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                {
                    rmat_this = workspace.rmat.data() + workspace.ix_arr[i]*workspace.n_from;
                    for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                    {
                        rmat_this[workspace.ix_arr[j] - workspace.n_from]++;
                    }
                }
            }
        }
        return;
    }

    else if (curr_tree > 0 && !as_kernel)
    {
        if (!workspace.tmat_sep.empty())
            increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                  prediction_data.nrows, workspace.tmat_sep.data(), -1.);
        else if (!workspace.rmat.empty())
            increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.n_from,
                                            prediction_data.nrows, workspace.rmat.data(), -1.);
    }

    if (prediction_data.Xc_indptr != NULL && workspace.tmat_sep.size())
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    /* reconstruct linear combination */
    size_t ncols_numeric = 0;
    size_t ncols_categ   = 0;
    std::fill(workspace.comb_val.begin(), workspace.comb_val.begin() + (workspace.end - workspace.st + 1), 0);
    double unused;
    if (prediction_data.categ_data != NULL || prediction_data.Xc_indptr != NULL)
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
        {
            switch(hplanes[curr_tree].col_type[col])
            {
                case Numeric:
                {
                    if (prediction_data.Xc_indptr == NULL)
                        add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                        prediction_data.numeric_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                        hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                        (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                        model_outputs.missing_action, NULL, NULL, false);
                    else
                        add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                                        hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                                        prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                        hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                        (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                        model_outputs.missing_action, NULL, NULL, false);
                    ncols_numeric++;
                    break;
                }

                case Categorical:
                {
                    switch(model_outputs.cat_split_type)
                    {
                        case SingleCateg:
                        {
                            add_linear_comb<ldouble_safe>(
                                            workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                            prediction_data.categ_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                            (int)0, NULL, hplanes[curr_tree].fill_new[ncols_categ],
                                            hplanes[curr_tree].chosen_cat[ncols_categ],
                                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                            workspace.comb_val[0], NULL, NULL, model_outputs.new_cat_action,
                                            model_outputs.missing_action, SingleCateg, false);
                            break;
                        }

                        case SubSet:
                        {
                            add_linear_comb<ldouble_safe>(
                                            workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                            prediction_data.categ_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                            (int) hplanes[curr_tree].cat_coef[ncols_categ].size(),
                                            hplanes[curr_tree].cat_coef[ncols_categ].data(), (double) 0, (int) 0,
                                            (model_outputs.missing_action == Fail)? unused : hplanes[curr_tree].fill_val[col],
                                            hplanes[curr_tree].fill_new[ncols_categ], NULL, NULL,
                                            model_outputs.new_cat_action, model_outputs.missing_action, SubSet, false);
                            break;
                        }
                    }
                    ncols_categ++;
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            } 
        }
    }

    
    else /* faster version for numerical-only */
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
            add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                            prediction_data.numeric_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                            hplanes[curr_tree].coef[col], (double)0, hplanes[curr_tree].mean[col],
                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                            model_outputs.missing_action, NULL, NULL, false);
    }

    /* divide data */
    size_t split_ix = divide_subset_split(workspace.ix_arr.data(), workspace.comb_val.data(),
                                          workspace.st, workspace.end, hplanes[curr_tree].split_point);

    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (split_ix > workspace.st)
    {
        workspace.end = split_ix - 1;
        traverse_hplane_sim<PredictionData, ldouble_safe>(
                            workspace,
                            prediction_data,
                            model_outputs,
                            hplanes,
                            hplanes[curr_tree].hplane_left,
                            as_kernel);
    }

    if (split_ix <= orig_end)
    {
        workspace.st  = split_ix;
        workspace.end = orig_end;
        traverse_hplane_sim<PredictionData, ldouble_safe>(
                            workspace,
                            prediction_data,
                            model_outputs,
                            hplanes,
                            hplanes[curr_tree].hplane_right,
                            as_kernel);
    }

}